

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O0

void __thiscall MeshDenoisingViaL0Minimization::denoise(MeshDenoisingViaL0Minimization *this)

{
  ParameterSet *pPVar1;
  bool bVar2;
  size_t sVar3;
  undefined1 local_3e0 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> delta;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  coef;
  vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
  edge_vertex_handle;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  area_based_edge_operator;
  MatrixXd initial_vertices_matrix;
  string local_360 [32];
  double local_340;
  double lambda;
  string local_330 [39];
  allocator local_309;
  string local_308 [32];
  double local_2e8;
  double alpha;
  double mu_alpha;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  double local_260;
  double beta_max;
  double beta;
  double mu_beta;
  undefined1 local_238 [8];
  TriMesh mesh;
  MeshDenoisingViaL0Minimization *this_local;
  
  mesh.super_Mesh.
  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>._544_8_
       = this;
  DataManager::getNoisyMesh((TriMesh *)local_238,(this->super_MeshDenoisingBase).data_manager_);
  sVar3 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)local_238);
  if (sVar3 == 0) {
    mu_beta._0_4_ = 1;
  }
  else {
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"mu_beta",&local_281);
    bVar2 = ParameterSet::getValue(pPVar1,(string *)local_280,&beta);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"beta",&local_2a9);
      bVar2 = ParameterSet::getValue(pPVar1,(string *)local_2a8,&beta_max);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d0,"beta_max",(allocator *)((long)&mu_alpha + 7));
        bVar2 = ParameterSet::getValue(pPVar1,(string *)local_2d0,&local_260);
        std::__cxx11::string::~string(local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&mu_alpha + 7));
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_308,"mu_alpha",&local_309);
          bVar2 = ParameterSet::getValue(pPVar1,(string *)local_308,&alpha);
          std::__cxx11::string::~string(local_308);
          std::allocator<char>::~allocator((allocator<char> *)&local_309);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_330,"alpha",(allocator *)((long)&lambda + 7));
            bVar2 = ParameterSet::getValue(pPVar1,(string *)local_330,&local_2e8);
            std::__cxx11::string::~string(local_330);
            std::allocator<char>::~allocator((allocator<char> *)((long)&lambda + 7));
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_360,"lambda",
                         (allocator *)
                         ((long)&initial_vertices_matrix.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_cols + 7));
              bVar2 = ParameterSet::getValue(pPVar1,(string *)local_360,&local_340);
              std::__cxx11::string::~string(local_360);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&initial_vertices_matrix.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_cols + 7));
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                          ((Matrix<double,__1,__1,_0,__1,__1> *)
                           &area_based_edge_operator.
                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                getInitialVerticesMatrix
                          (this,(TriMesh *)local_238,
                           (MatrixXd *)
                           &area_based_edge_operator.
                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&edge_vertex_handle.
                             super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                ::vector((vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                          *)&coef.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)&delta.
                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)local_3e0);
                for (; beta_max < local_260; beta_max = beta * beta_max) {
                  calculateAreaBasedEdgeOperator
                            (this,(TriMesh *)local_238,
                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              *)&edge_vertex_handle.
                                 super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                              *)&coef.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)&delta.
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  solveDelta(this,(vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   *)&edge_vertex_handle.
                                      super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_340,
                             beta_max,(vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       *)local_3e0);
                  solveVertices(this,(TriMesh *)local_238,
                                (MatrixXd *)
                                &area_based_edge_operator.
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                                 *)&coef.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&delta.
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 *)local_3e0,local_2e8,beta_max);
                  local_2e8 = alpha * local_2e8;
                }
                DataManager::setMesh
                          ((this->super_MeshDenoisingBase).data_manager_,(TriMesh *)local_238);
                DataManager::setDenoisedMesh
                          ((this->super_MeshDenoisingBase).data_manager_,(TriMesh *)local_238);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           *)local_3e0);
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&delta.
                              super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                           *)&coef.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           *)&edge_vertex_handle.
                              super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                          ((Matrix<double,__1,__1,_0,__1,__1> *)
                           &area_based_edge_operator.
                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                mu_beta._0_4_ = 0;
              }
              else {
                mu_beta._0_4_ = 1;
              }
            }
            else {
              mu_beta._0_4_ = 1;
            }
          }
          else {
            mu_beta._0_4_ = 1;
          }
        }
        else {
          mu_beta._0_4_ = 1;
        }
      }
      else {
        mu_beta._0_4_ = 1;
      }
    }
    else {
      mu_beta._0_4_ = 1;
    }
  }
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::~TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_238);
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // get parameters
    double mu_beta, beta, beta_max;
    if(!parameter_set_->getValue(string("mu_beta"), mu_beta))
        return;
    if(!parameter_set_->getValue(string("beta"), beta))
        return;
    if(!parameter_set_->getValue(string("beta_max"), beta_max))
        return;
    double mu_alpha, alpha;
    if(!parameter_set_->getValue(string("mu_alpha"), mu_alpha))
        return;
    if(!parameter_set_->getValue(string("alpha"), alpha))
        return;
    double lambda;
    if(!parameter_set_->getValue(string("lambda"), lambda))
        return;

    // do optimization
    Eigen::MatrixXd initial_vertices_matrix;
    getInitialVerticesMatrix(mesh, initial_vertices_matrix);

    std::vector<TriMesh::Point> area_based_edge_operator;
    std::vector< std::vector<TriMesh::VertexHandle> > edge_vertex_handle;
    std::vector< std::vector<double> > coef;
    std::vector<TriMesh::Point> delta;

    while(beta < beta_max){
        calculateAreaBasedEdgeOperator(mesh, area_based_edge_operator, edge_vertex_handle, coef);
        // update delta
        solveDelta(area_based_edge_operator, lambda, beta, delta);
        // update vertices
        solveVertices(mesh, initial_vertices_matrix, edge_vertex_handle, coef, delta, alpha, beta);
        beta *= mu_beta;
        alpha *= mu_alpha;
    }

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}